

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

int WriteOptionString(TidyOptionImpl *option,ctmbstr sval,StreamOut *out)

{
  char cVar1;
  int extraout_EAX;
  char *pcVar2;
  
  pcVar2 = option->name;
  cVar1 = *pcVar2;
  while (cVar1 != '\0') {
    pcVar2 = pcVar2 + 1;
    prvTidyWriteChar((int)cVar1,out);
    cVar1 = *pcVar2;
  }
  prvTidyWriteChar(0x3a,out);
  prvTidyWriteChar(0x20,out);
  cVar1 = *sval;
  if (cVar1 != '\0') {
    pcVar2 = sval + 1;
    do {
      prvTidyWriteChar((int)cVar1,out);
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  prvTidyWriteChar(10,out);
  return extraout_EAX;
}

Assistant:

static int  WriteOptionString( const TidyOptionImpl* option,
                               ctmbstr sval, StreamOut* out )
{
  ctmbstr cp = option->name;
  while ( *cp )
      TY_(WriteChar)( *cp++, out );
  TY_(WriteChar)( ':', out );
  TY_(WriteChar)( ' ', out );
  cp = sval;
  while ( *cp )
      TY_(WriteChar)( *cp++, out );
  TY_(WriteChar)( '\n', out );
  return 0;
}